

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool __thiscall QWidgetPrivate::isFocusChainConsistent(QWidgetPrivate *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  QDebug QVar6;
  anon_union_4_2_7218e939_for_QLoggingCategory_2 aVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  QDebug *this_00;
  long lVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  undefined1 local_d8 [8];
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  QDebug local_a8;
  undefined1 local_a0 [8];
  QDebug local_98;
  undefined1 local_90 [8];
  QDebug local_88;
  QWidgetData *local_80;
  undefined1 local_78 [8];
  QWidgetData *local_70 [3];
  QLoggingCategory local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  QLoggingCategory::QLoggingCategory(&local_58,"qt.widgets.focus",QtDebugMsg);
  aVar7 = local_58.field_2;
  QLoggingCategory::~QLoggingCategory(&local_58);
  bVar9 = true;
  if (((uint)aVar7 & 1) != 0) {
    lVar11 = *(long *)&this->field_0x8;
    if ((*(long *)(*(long *)(lVar11 + 8) + 0x80) != lVar11) ||
       (*(long *)(*(long *)(lVar11 + 8) + 0x88) != lVar11)) {
      uVar8 = 0;
      lVar11 = lVar1;
      do {
        uVar10 = uVar8;
        QApplication::allWidgets();
        piVar4 = (int *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
        uVar5 = CONCAT44(local_58.placeholder,local_58.field_2);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_),8,0x10)
            ;
          }
        }
        bVar9 = true;
        if (uVar5 <= uVar10) break;
        lVar2 = *(long *)(*(long *)(lVar11 + 8) + 0x88);
        if ((lVar2 == 0) || (lVar3 = *(long *)(*(long *)(lVar11 + 8) + 0x80), lVar3 == 0)) {
          lcWidgetFocus();
          if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
              != 0) {
            local_58.d._0_4_ = 2;
            local_58.d._4_4_ = 0;
            local_58.name._0_4_ = 0;
            local_58.name._4_4_ = 0;
            local_58.field_2 = (anon_union_4_2_7218e939_for_QLoggingCategory_2)0x0;
            local_58.placeholder[0] = false;
            local_58.placeholder[1] = false;
            local_58.placeholder[2] = false;
            local_58.placeholder[3] = false;
            local_40 = lcWidgetFocus::category.name;
            QMessageLogger::debug();
            QVar6.stream = local_a8.stream;
            QVar12.m_data = (storage_type *)0x11;
            QVar12.m_size = (qsizetype)local_70;
            QString::fromUtf8(QVar12);
            QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_70);
            if (local_70[0] != (QWidgetData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_70[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_a8.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
            }
            local_a0 = (undefined1  [8])local_a8.stream;
            *(int *)(local_a8.stream + 0x28) = *(int *)(local_a8.stream + 0x28) + 1;
            ::operator<<((Stream *)&local_98,(QWidget *)local_a0);
            QVar6.stream = local_98.stream;
            QVar13.m_data = (storage_type *)0x14;
            QVar13.m_size = (qsizetype)local_70;
            QString::fromUtf8(QVar13);
            QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_70);
            if (local_70[0] != (QWidgetData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_70[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_98.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_98.stream,' ');
            }
            local_90 = (undefined1  [8])local_98.stream;
            *(int *)(local_98.stream + 0x28) = *(int *)(local_98.stream + 0x28) + 1;
            ::operator<<((Stream *)&local_88,(QWidget *)local_90);
            QVar6.stream = local_88.stream;
            QVar14.m_data = (storage_type *)0x10;
            QVar14.m_size = (qsizetype)local_70;
            QString::fromUtf8(QVar14);
            QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_70);
            if (local_70[0] != (QWidgetData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_70[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_88.stream,' ');
            }
            local_80 = (QWidgetData *)local_88.stream;
            *(int *)(local_88.stream + 0x28) = *(int *)(local_88.stream + 0x28) + 1;
            ::operator<<((Stream *)local_78,(QWidget *)&local_80);
            QDebug::~QDebug((QDebug *)local_78);
            QDebug::~QDebug((QDebug *)&local_80);
            QDebug::~QDebug(&local_88);
            QDebug::~QDebug((QDebug *)local_90);
            QDebug::~QDebug(&local_98);
            this_00 = (QDebug *)local_a0;
LAB_0031168c:
            QDebug::~QDebug(this_00);
            QDebug::~QDebug(&local_a8);
          }
LAB_0031169b:
          bVar9 = false;
          break;
        }
        if ((*(long *)(*(long *)(lVar3 + 8) + 0x88) != lVar11) ||
           (*(long *)(*(long *)(lVar2 + 8) + 0x80) != lVar11)) {
          lcWidgetFocus();
          if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
              != 0) {
            local_58.d._0_4_ = 2;
            local_58.d._4_4_ = 0;
            local_58.name._0_4_ = 0;
            local_58.name._4_4_ = 0;
            local_58.field_2 = (anon_union_4_2_7218e939_for_QLoggingCategory_2)0x0;
            local_58.placeholder[0] = false;
            local_58.placeholder[1] = false;
            local_58.placeholder[2] = false;
            local_58.placeholder[3] = false;
            local_40 = lcWidgetFocus::category.name;
            QMessageLogger::debug();
            QVar6.stream = local_a8.stream;
            QVar15.m_data = (storage_type *)0x1c;
            QVar15.m_size = (qsizetype)local_70;
            QString::fromUtf8(QVar15);
            QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_70);
            if (local_70[0] != (QWidgetData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_70[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_a8.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
            }
            local_c8 = (undefined1  [8])local_a8.stream;
            *(int *)(local_a8.stream + 0x28) = *(int *)(local_a8.stream + 0x28) + 1;
            ::operator<<((Stream *)&local_98,(QWidget *)local_c8);
            QVar6.stream = local_98.stream;
            QVar16.m_data = (storage_type *)0x14;
            QVar16.m_size = (qsizetype)local_70;
            QString::fromUtf8(QVar16);
            QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_70);
            if (local_70[0] != (QWidgetData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_70[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_98.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_98.stream,' ');
            }
            local_c0 = (undefined1  [8])local_98.stream;
            *(int *)(local_98.stream + 0x28) = *(int *)(local_98.stream + 0x28) + 1;
            ::operator<<((Stream *)&local_88,(QWidget *)local_c0);
            QVar6.stream = local_88.stream;
            QVar17.m_data = (storage_type *)0x10;
            QVar17.m_size = (qsizetype)local_70;
            QString::fromUtf8(QVar17);
            QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_70);
            if (local_70[0] != (QWidgetData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_70[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_88.stream,' ');
            }
            local_b8._0_8_ = local_88.stream;
            *(int *)(local_88.stream + 0x28) = *(int *)(local_88.stream + 0x28) + 1;
            ::operator<<((Stream *)(local_b8 + 8),(QWidget *)local_b8);
            QDebug::~QDebug((QDebug *)(local_b8 + 8));
            QDebug::~QDebug((QDebug *)local_b8);
            QDebug::~QDebug(&local_88);
            QDebug::~QDebug((QDebug *)local_c0);
            QDebug::~QDebug(&local_98);
            this_00 = (QDebug *)local_c8;
            goto LAB_0031168c;
          }
          goto LAB_0031169b;
        }
        uVar8 = uVar10 + 1;
        lVar11 = lVar3;
      } while (lVar3 != lVar1);
      if (uVar5 <= uVar10) {
        lcWidgetFocus();
        if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
            0) {
          local_58.d._0_4_ = 2;
          local_58.d._4_4_ = 0;
          local_58.name._0_4_ = 0;
          local_58.name._4_4_ = 0;
          local_58.field_2 = (anon_union_4_2_7218e939_for_QLoggingCategory_2)0x0;
          local_58.placeholder[0] = false;
          local_58.placeholder[1] = false;
          local_58.placeholder[2] = false;
          local_58.placeholder[3] = false;
          local_40 = lcWidgetFocus::category.name;
          QMessageLogger::debug();
          QVar6.stream = local_a8.stream;
          QVar18.m_data = (storage_type *)0x18;
          QVar18.m_size = (qsizetype)local_70;
          QString::fromUtf8(QVar18);
          QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_70);
          if (local_70[0] != (QWidgetData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate((QArrayData *)local_70[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_a8.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_a8.stream,' ');
          }
          local_d8 = (undefined1  [8])local_a8.stream;
          *(int *)(local_a8.stream + 0x28) = *(int *)(local_a8.stream + 0x28) + 1;
          ::operator<<((Stream *)&local_98,(QWidget *)local_d8);
          QVar6.stream = local_98.stream;
          QVar19.m_data = (storage_type *)0x2;
          QVar19.m_size = (qsizetype)local_70;
          QString::fromUtf8(QVar19);
          QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_70);
          if (local_70[0] != (QWidgetData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate((QArrayData *)local_70[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_98.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_98.stream,' ');
          }
          local_d0 = (undefined1  [8])local_98.stream;
          *(int *)(local_98.stream + 0x28) = *(int *)(local_98.stream + 0x28) + 1;
          ::operator<<((Stream *)&local_88,(QWidget *)local_d0);
          QVar6.stream = local_88.stream;
          QVar20.m_data = (storage_type *)0xe;
          QVar20.m_size = (qsizetype)local_70;
          QString::fromUtf8(QVar20);
          QTextStream::operator<<((QTextStream *)QVar6.stream,(QString *)local_70);
          if (local_70[0] != (QWidgetData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&local_70[0]->winid)->_q_value).super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate((QArrayData *)local_70[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_88.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_88.stream,' ');
          }
          QDebug::~QDebug(&local_88);
          QDebug::~QDebug((QDebug *)local_d0);
          QDebug::~QDebug(&local_98);
          QDebug::~QDebug((QDebug *)local_d8);
          QDebug::~QDebug(&local_a8);
        }
        bVar9 = false;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QWidgetPrivate::isFocusChainConsistent() const
{
    Q_Q(const QWidget);
    const bool skip = !QLoggingCategory("qt.widgets.focus").isDebugEnabled();
    if (skip)
        return true;

    if (!isInFocusChain())
        return true;

    const QWidget *position = q;

    for (int i = 0; i < QApplication::allWidgets().count(); ++i) {
        if (!FOCUS_PREV(position) || !FOCUS_NEXT(position)) {
            qCDebug(lcWidgetFocus) << "Nullptr found at:" << position
                             << "Previous pointing to" << FOCUS_PREV(position)
                             << "Next pointing to" << FOCUS_NEXT(position);
            return false;
        }
        if (!(FOCUS_PREV(FOCUS_NEXT(position)) == position
            && FOCUS_NEXT(FOCUS_PREV(position)) == position)) {
            qCDebug(lcWidgetFocus) << "Inconsistent focus chain at:" << position
                             << "Previous pointing to" << FOCUS_PREV(FOCUS_NEXT(position))
                             << "Next pointing to" << FOCUS_NEXT(FOCUS_PREV(position));
            return false;
        }
        position = FOCUS_NEXT(position);
        if (position == q)
            return true;

    }

    qCDebug(lcWidgetFocus) << "Focus chain leading from" << q << "to" << position << "is not closed.";
    return false;
}